

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<unsigned_short>::resize(ImVector<unsigned_short> *this,int new_size)

{
  int in_ESI;
  ImVector<unsigned_short> *in_RDI;
  ImVector<unsigned_short> *unaff_retaddr;
  ImVector<unsigned_short> *pIVar1;
  
  if (in_RDI->Capacity < in_ESI) {
    pIVar1 = in_RDI;
    _grow_capacity(in_RDI,in_ESI);
    reserve(unaff_retaddr,(int)((ulong)pIVar1 >> 0x20));
  }
  in_RDI->Size = in_ESI;
  return;
}

Assistant:

inline void         resize(int new_size)                { if (new_size > Capacity) reserve(_grow_capacity(new_size)); Size = new_size; }